

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall
cbtGImpactMeshShape::buildMeshParts
          (cbtGImpactMeshShape *this,cbtStridingMeshInterface *meshInterface)

{
  int iVar1;
  cbtGImpactMeshShapePart **ptr;
  int iVar2;
  int iVar3;
  cbtGImpactMeshShapePart *this_00;
  cbtGImpactMeshShapePart **ppcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  iVar2 = (*meshInterface->_vptr_cbtStridingMeshInterface[7])(meshInterface);
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      this_00 = (cbtGImpactMeshShapePart *)cbtAlignedAllocInternal(0x118,0x10);
      cbtGImpactMeshShapePart::cbtGImpactMeshShapePart(this_00,meshInterface,iVar2);
      iVar3 = (this->m_mesh_parts).m_size;
      iVar1 = (this->m_mesh_parts).m_capacity;
      if (iVar3 == iVar1) {
        iVar7 = iVar3 * 2;
        if (iVar3 == 0) {
          iVar7 = 1;
        }
        if (iVar1 < iVar7) {
          if (iVar7 == 0) {
            ppcVar4 = (cbtGImpactMeshShapePart **)0x0;
          }
          else {
            ppcVar4 = (cbtGImpactMeshShapePart **)cbtAlignedAllocInternal((long)iVar7 << 3,0x10);
          }
          lVar5 = (long)(this->m_mesh_parts).m_size;
          if (0 < lVar5) {
            lVar6 = 0;
            do {
              ppcVar4[lVar6] = (this->m_mesh_parts).m_data[lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar5 != lVar6);
          }
          ptr = (this->m_mesh_parts).m_data;
          if (ptr != (cbtGImpactMeshShapePart **)0x0) {
            if ((this->m_mesh_parts).m_ownsMemory == true) {
              cbtAlignedFreeInternal(ptr);
            }
            (this->m_mesh_parts).m_data = (cbtGImpactMeshShapePart **)0x0;
          }
          (this->m_mesh_parts).m_ownsMemory = true;
          (this->m_mesh_parts).m_data = ppcVar4;
          (this->m_mesh_parts).m_capacity = iVar7;
        }
      }
      iVar3 = (this->m_mesh_parts).m_size;
      (this->m_mesh_parts).m_data[iVar3] = this_00;
      (this->m_mesh_parts).m_size = iVar3 + 1;
      iVar2 = iVar2 + 1;
      iVar3 = (*meshInterface->_vptr_cbtStridingMeshInterface[7])(meshInterface);
    } while (iVar2 < iVar3);
  }
  return;
}

Assistant:

void buildMeshParts(cbtStridingMeshInterface* meshInterface)
	{
		for (int i = 0; i < meshInterface->getNumSubParts(); ++i)
		{
			cbtGImpactMeshShapePart* newpart = new cbtGImpactMeshShapePart(meshInterface, i);
			m_mesh_parts.push_back(newpart);
		}
	}